

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapRule.c
# Opt level: O3

Vec_Int_t * Amap_CreateRulesFromDsd(Amap_Lib_t *pLib,Kit_DsdNtk_t *p)

{
  int iVar1;
  uint uVar2;
  int *piVar3;
  Vec_Int_t *pVVar4;
  long lVar5;
  
  if (p->nVars < 2) {
    __assert_fail("p->nVars >= 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/amap/amapRule.c"
                  ,0xed,"Vec_Int_t *Amap_CreateRulesFromDsd(Amap_Lib_t *, Kit_DsdNtk_t *)");
  }
  pVVar4 = Amap_CreateRulesFromDsd_rec(pLib,p,p->Root & 0xfffffffe);
  if (((pVVar4 != (Vec_Int_t *)0x0) && ((p->Root & 1) != 0)) &&
     (iVar1 = pVVar4->nSize, 0 < (long)iVar1)) {
    piVar3 = pVVar4->pArray;
    lVar5 = 0;
    do {
      uVar2 = piVar3[lVar5];
      if ((int)uVar2 < 0) {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                      ,0x131,"int Abc_LitNot(int)");
      }
      piVar3[lVar5] = uVar2 ^ 1;
      lVar5 = lVar5 + 1;
    } while (iVar1 != lVar5);
  }
  return pVVar4;
}

Assistant:

Vec_Int_t * Amap_CreateRulesFromDsd( Amap_Lib_t * pLib, Kit_DsdNtk_t * p )
{
    Vec_Int_t * vNods;
    int iNod, i;
    assert( p->nVars >= 2 );
    vNods = Amap_CreateRulesFromDsd_rec( pLib, p, Abc_LitRegular(p->Root) );
    if ( vNods == NULL )
        return NULL;
    if ( Abc_LitIsCompl(p->Root) )
    {
        Vec_IntForEachEntry( vNods, iNod, i )
            Vec_IntWriteEntry( vNods, i, Abc_LitNot(iNod) );
    }
    return vNods;
}